

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithStackLimit::runTestCase(TestCharReaderTestparseWithStackLimit *this)

{
  undefined1 uVar1;
  uint uVar2;
  Value *pVVar3;
  CharReader *expr;
  long in_RDI;
  bool _threw;
  string errs_1;
  CharReader *reader_1;
  bool ok;
  string errs;
  CharReader *reader;
  char doc [25];
  Value root;
  CharReaderBuilder b;
  Value *in_stack_fffffffffffffe38;
  Value *in_stack_fffffffffffffe40;
  CharReaderBuilder *this_00;
  char *in_stack_fffffffffffffe48;
  CharReaderBuilder *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  CharReader *file;
  TestResult *in_stack_fffffffffffffe60;
  TestResult *this_01;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string local_158 [16];
  Value *in_stack_fffffffffffffeb8;
  Value *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  CharReader *pCVar4;
  uint in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  Value *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  TestResult *in_stack_fffffffffffffef0;
  string local_d8 [32];
  CharReader *local_b8;
  char local_88 [40];
  undefined1 local_60 [96];
  
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffe50);
  Json::Value::Value((Value *)in_stack_fffffffffffffe50,
                     (ValueType)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  builtin_strncpy(local_88 + 0x10,"value\" }",9);
  builtin_strncpy(local_88,"{ \"property\" : \"",0x10);
  Json::Value::Value(in_stack_fffffffffffffe40,(Int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  Json::Value::operator[]((Value *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Json::Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  local_b8 = Json::CharReaderBuilder::newCharReader
                       ((CharReaderBuilder *)
                        CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::string(local_d8);
  uVar2 = (*local_b8->_vptr_CharReader[2])(local_b8,local_88,local_88 + 0x18,local_60,local_d8);
  if ((uVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_fffffffffffffe48);
  }
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  if (!(bool)uVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_fffffffffffffe48);
  }
  this_01 = *(TestResult **)(in_RDI + 8);
  Json::Value::operator[]((Value *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Json::Value::Value(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  JsonTest::checkEqual<char_const*,Json::Value>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
  Json::Value::~Value((Value *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  file = local_b8;
  if (local_b8 != (CharReader *)0x0) {
    (*local_b8->_vptr_CharReader[1])();
  }
  std::__cxx11::string::~string(local_d8);
  Json::Value::Value(in_stack_fffffffffffffe40,(Int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  pVVar3 = Json::Value::operator[]((Value *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  uVar2 = (uint)((ulong)pVVar3 >> 0x20);
  Json::Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Json::Value::~Value((Value *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  expr = Json::CharReaderBuilder::newCharReader
                   ((CharReaderBuilder *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  this_00 = (CharReaderBuilder *)local_158;
  pCVar4 = expr;
  std::__cxx11::string::string((string *)this_00);
  (*pCVar4->_vptr_CharReader[2])(pCVar4,local_88,local_88 + 0x18,local_60,this_00);
  JsonTest::TestResult::addFailure(this_01,(char *)file,uVar2,(char *)expr);
  if (pCVar4 != (CharReader *)0x0) {
    (*pCVar4->_vptr_CharReader[1])();
  }
  std::__cxx11::string::~string(local_158);
  Json::Value::~Value((Value *)CONCAT17(uVar1,in_stack_fffffffffffffe70));
  Json::CharReaderBuilder::~CharReaderBuilder(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithStackLimit) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"value\" }";
  {
  b.settings_["stackLimit"] = 2;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs == "");
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
  {
  b.settings_["stackLimit"] = 1;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  JSONTEST_ASSERT_THROWS(reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs));
  delete reader;
  }
}